

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O2

MatrixXd * __thiscall UKF::InitialiseCovariance(MatrixXd *__return_storage_ptr__,UKF *this)

{
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar1;
  Scalar local_118;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_110;
  Scalar local_f0;
  Scalar local_e8;
  Scalar local_e0;
  Scalar local_d8;
  Scalar local_d0;
  Scalar local_c8;
  Scalar local_c0;
  Scalar local_b8;
  Scalar local_b0;
  Scalar local_a8;
  Scalar local_a0;
  Scalar local_98;
  Scalar local_90;
  Scalar local_88;
  Scalar local_80;
  Scalar local_78;
  Scalar local_70;
  Scalar local_68;
  Scalar local_60;
  Scalar local_58;
  Scalar local_50;
  Scalar local_48;
  Scalar local_40;
  Scalar local_38;
  
  local_110.m_xpr._0_4_ = 5;
  local_118 = (Scalar)CONCAT44(local_118._4_4_,5);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,(int *)&local_110,
             (int *)&local_118);
  local_118 = 0.0043;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::CommaInitializer
            (&local_110,__return_storage_ptr__,&local_118);
  local_38 = -0.0013;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_110,&local_38);
  local_40 = 0.003;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_40);
  local_48 = -0.0022;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_48);
  local_50 = -0.002;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_50);
  local_58 = -0.0013;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_58);
  local_60 = 0.0077;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_60);
  local_68 = 0.0011;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_68);
  local_70 = 0.0071;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_70);
  local_78 = 0.006;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_78);
  local_80 = 0.003;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_80);
  local_88 = 0.0011;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_88);
  local_90 = 0.0054;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_90);
  local_98 = 0.0007;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_98);
  local_a0 = 0.0008;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_a0);
  local_a8 = -0.0022;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_a8);
  local_b0 = 0.0071;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_b0);
  local_b8 = 0.0007;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_b8);
  local_c0 = 0.0098;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_c0);
  local_c8 = 0.01;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_c8);
  local_d0 = -0.002;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_d0);
  local_d8 = 0.006;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_d8);
  local_e0 = 0.0008;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_e0);
  local_e8 = 0.01;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_e8);
  local_f0 = 0.0123;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar1,&local_f0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished(&local_110);
  return __return_storage_ptr__;
}

Assistant:

auto UKF::InitialiseCovariance() -> MatrixXd {
  MatrixXd P = MatrixXd(5, 5);
  P <<     0.0043,   -0.0013,    0.0030,   -0.0022,   -0.0020,
          -0.0013,    0.0077,    0.0011,    0.0071,    0.0060,
           0.0030,    0.0011,    0.0054,    0.0007,    0.0008,
          -0.0022,    0.0071,    0.0007,    0.0098,    0.0100,
          -0.0020,    0.0060,    0.0008,    0.0100,    0.0123;

  return P;
}